

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansicolor_sink-inl.h
# Opt level: O1

double __thiscall
spdlog::sinks::ansicolor_sink<spdlog::details::console_nullmutex>::log
          (ansicolor_sink<spdlog::details::console_nullmutex> *this,double __x)

{
  formatter *pfVar1;
  long in_RSI;
  ulong uVar2;
  size_t n_bytes;
  undefined1 *ptr;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar3;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar4;
  memory_buf_t formatted;
  undefined1 *local_148;
  size_t sStack_140;
  undefined8 local_138;
  code *local_130;
  undefined1 local_128 [264];
  
  *(undefined8 *)(in_RSI + 0x28) = 0;
  *(undefined8 *)(in_RSI + 0x30) = 0;
  sStack_140 = 0;
  local_130 = ::fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>::grow
  ;
  local_138 = 0xfa;
  pfVar1 = (this->formatter_)._M_t.
           super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>._M_t.
           super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
           super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl;
  local_148 = local_128;
  (*pfVar1->_vptr_formatter[2])(pfVar1,in_RSI,&local_148);
  n_bytes = sStack_140;
  ptr = local_148;
  if ((this->should_do_colors_ == true) && (*(ulong *)(in_RSI + 0x28) < *(ulong *)(in_RSI + 0x30)))
  {
    details::os::fwrite_bytes(local_148,*(ulong *)(in_RSI + 0x28),this->target_file_);
    uVar2 = (ulong)*(int *)(in_RSI + 0x10);
    if (6 < uVar2) {
      std::__throw_out_of_range_fmt("array::at: __n (which is %zu) >= _Nm (which is %zu)",uVar2,7);
    }
    details::os::fwrite_bytes
              ((this->colors_)._M_elems[uVar2]._M_dataplus._M_p,
               (this->colors_)._M_elems[uVar2]._M_string_length,this->target_file_);
    details::os::fwrite_bytes
              (local_148 + *(long *)(in_RSI + 0x28),
               *(long *)(in_RSI + 0x30) - *(long *)(in_RSI + 0x28),this->target_file_);
    details::os::fwrite_bytes((this->reset).data_,(this->reset).size_,this->target_file_);
    n_bytes = sStack_140 - *(long *)(in_RSI + 0x30);
    ptr = local_148 + *(long *)(in_RSI + 0x30);
  }
  details::os::fwrite_bytes(ptr,n_bytes,this->target_file_);
  fflush((FILE *)this->target_file_);
  uVar3 = extraout_XMM0_Da;
  uVar4 = extraout_XMM0_Db;
  if (local_148 != local_128) {
    free(local_148);
    uVar3 = extraout_XMM0_Da_00;
    uVar4 = extraout_XMM0_Db_00;
  }
  return (double)CONCAT44(uVar4,uVar3);
}

Assistant:

SPDLOG_INLINE void ansicolor_sink<ConsoleMutex>::log(const details::log_msg &msg) {
    // Wrap the originally formatted message in color codes.
    // If color is not supported in the terminal, log as is instead.
    std::lock_guard<mutex_t> lock(mutex_);
    msg.color_range_start = 0;
    msg.color_range_end = 0;
    memory_buf_t formatted;
    formatter_->format(msg, formatted);
    if (should_do_colors_ && msg.color_range_end > msg.color_range_start) {
        // before color range
        print_range_(formatted, 0, msg.color_range_start);
        // in color range
        print_ccode_(colors_.at(static_cast<size_t>(msg.level)));
        print_range_(formatted, msg.color_range_start, msg.color_range_end);
        print_ccode_(reset);
        // after color range
        print_range_(formatted, msg.color_range_end, formatted.size());
    } else  // no color
    {
        print_range_(formatted, 0, formatted.size());
    }
    fflush(target_file_);
}